

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-quantize-stats.cpp
# Opt level: O0

void test_roundtrip_on_chunk
               (ggml_tensor *layer,int64_t offset,int64_t chunk_size,ggml_type_traits *qfns,
               ggml_type_traits_cpu *qfns_cpu,bool use_reference,float *input_scratch,
               char *quantized_scratch,float *output_scratch,error_stats *stats)

{
  long lVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  error_stats *in_RDI;
  undefined8 *in_R8;
  byte in_R9B;
  float fVar2;
  float *unaff_retaddr;
  int i;
  int local_30;
  
  if ((int)in_RDI->num_samples == 1) {
    for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
      fVar2 = (float)ggml_get_f32_1d(in_RDI,local_30 + (int)in_RSI);
      _i[local_30] = fVar2;
    }
  }
  else {
    lVar1 = ggml_get_data_f32(in_RDI);
    _i = (float *)(lVar1 + in_RSI * 4);
  }
  if ((in_R9B & 1) == 0) {
    (*(code *)*in_R8)(_i,qfns_cpu,in_RDX);
  }
  else {
    (**(code **)(in_RCX + 0x30))(_i,qfns_cpu,in_RDX);
  }
  (**(code **)(in_RCX + 0x28))(qfns_cpu,qfns,in_RDX);
  update_error_stats((int64_t)qfns_cpu,_i,unaff_retaddr,in_RDI);
  return;
}

Assistant:

static void test_roundtrip_on_chunk(
    const ggml_tensor * layer, int64_t offset, int64_t chunk_size, const ggml_type_traits & qfns, const ggml_type_traits_cpu & qfns_cpu, bool use_reference,
    float * input_scratch, char * quantized_scratch, float * output_scratch, error_stats & stats
) {
    if (layer->type == GGML_TYPE_F16) {
        for (int i = 0; i < chunk_size; i++) {
            input_scratch[i] = ggml_get_f32_1d(layer, i + offset);
        }
    } else {
        input_scratch = ggml_get_data_f32(layer) + offset;
    }

    if (use_reference) {
        qfns.from_float_ref(input_scratch, quantized_scratch, chunk_size);
    } else {
        qfns_cpu.from_float(input_scratch, quantized_scratch, chunk_size);
    }
    qfns.to_float(quantized_scratch, output_scratch, chunk_size);

    update_error_stats(chunk_size, input_scratch, output_scratch, stats);
}